

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
* __thiscall
Hero::getSprite(vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *__return_storage_ptr__,Hero *this)

{
  initializer_list<int> __l;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_00;
  allocator_type local_2e;
  allocator_type local_2d;
  int local_2c;
  vector<int,_std::allocator<int>_> local_28;
  
  local_2c = 2;
  __l._M_len = 1;
  __l._M_array = &local_2c;
  std::vector<int,_std::allocator<int>_>::vector(&local_28,__l,&local_2d);
  __l_00._M_len = 1;
  __l_00._M_array = &local_28;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(__return_storage_ptr__,__l_00,&local_2e);
  if (local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

vvi getSprite() const { return {{character}}; }